

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::CondVar::Wakeup(CondVar *this,PerThreadSynch *w)

{
  Mutex *mu_00;
  bool bVar1;
  Mutex *mu;
  PerThreadSynch *w_local;
  CondVar *this_local;
  
  bVar1 = synchronization_internal::KernelTimeout::has_timeout(&w->waitp->timeout);
  if ((bVar1) || (w->waitp->cvmu == (Mutex *)0x0)) {
    mu_00 = w->waitp->cvmu;
    w->next = (PerThreadSynch *)0x0;
    std::atomic<absl::base_internal::PerThreadSynch::State>::store
              (&w->state,kAvailable,memory_order_release);
    Mutex::IncrementSynchSem(mu_00,w);
  }
  else {
    Mutex::Fer(w->waitp->cvmu,w);
  }
  return;
}

Assistant:

void CondVar::Wakeup(PerThreadSynch *w) {
  if (w->waitp->timeout.has_timeout() || w->waitp->cvmu == nullptr) {
    // The waiting thread only needs to observe "w->state == kAvailable" to be
    // released, we must cache "cvmu" before clearing "next".
    Mutex *mu = w->waitp->cvmu;
    w->next = nullptr;
    w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
    Mutex::IncrementSynchSem(mu, w);
  } else {
    w->waitp->cvmu->Fer(w);
  }
}